

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_set_parity(cio_uart *port,cio_uart_parity parity)

{
  undefined1 local_58 [4];
  cio_error err;
  termios tty;
  cio_uart_parity parity_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty.c_ispeed = parity;
    unique0x100000c0 = port;
    port_local._4_4_ = get_current_settings(port,(termios *)local_58);
    if (port_local._4_4_ == CIO_SUCCESS) {
      switch(tty.c_ispeed) {
      case 0:
        tty.c_iflag = tty.c_iflag & 0xbffffdff | 0x100;
        break;
      case 1:
        tty.c_iflag = tty.c_iflag & 0xbfffffff | 0x300;
        break;
      case 2:
        tty.c_iflag = tty.c_iflag & 0xbffffeff;
        break;
      case 3:
        tty.c_iflag = tty.c_iflag | 0x40000300;
        break;
      case 4:
        tty.c_iflag = tty.c_iflag & 0xfffffdff | 0x40000100;
        break;
      default:
        return CIO_INVALID_ARGUMENT;
      }
      port_local._4_4_ = set_termios((stack0xffffffffffffffe8->impl).ev.fd,(termios *)local_58);
      if (port_local._4_4_ == CIO_SUCCESS) {
        port_local._4_4_ = CIO_SUCCESS;
      }
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_set_parity(const struct cio_uart *port, enum cio_uart_parity parity)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (parity) {
	case CIO_UART_PARITY_NONE:
		tty.c_cflag &= ~(tcflag_t)CMSPAR;
		tty.c_cflag &= ~(tcflag_t)PARENB;
		break;
	case CIO_UART_PARITY_ODD:
		tty.c_cflag &= ~(tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag |= (tcflag_t)PARODD;
		break;
	case CIO_UART_PARITY_EVEN:
		tty.c_cflag &= ~(tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag &= ~(tcflag_t)PARODD;
		break;
	case CIO_UART_PARITY_MARK:
		tty.c_cflag |= (tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag |= (tcflag_t)PARODD;
		break;
	case CIO_UART_PARITY_SPACE:
		tty.c_cflag |= (tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag &= ~(tcflag_t)PARODD;
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}